

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O0

void __thiscall QEventDispatcherGlib::~QEventDispatcherGlib(QEventDispatcherGlib *this)

{
  QEventDispatcherGlibPrivate *pQVar1;
  qsizetype qVar2;
  reference ppGVar3;
  undefined8 *in_RDI;
  GPollFDWithQSocketNotifier *p;
  int i;
  QEventDispatcherGlibPrivate *d;
  qsizetype in_stack_ffffffffffffffb8;
  QTimerInfoList *in_stack_ffffffffffffffc0;
  int local_14;
  
  *in_RDI = &PTR_metaObject_00beee20;
  pQVar1 = d_func((QEventDispatcherGlib *)0x8cf47a);
  QTimerInfoList::clearTimers(in_stack_ffffffffffffffc0);
  QTimerInfoList::~QTimerInfoList((QTimerInfoList *)0x8cf4ab);
  g_source_destroy(pQVar1->timerSource);
  g_source_unref(pQVar1->timerSource);
  pQVar1->timerSource = (GTimerSource *)0x0;
  g_source_destroy(pQVar1->idleTimerSource);
  g_source_unref(pQVar1->idleTimerSource);
  pQVar1->idleTimerSource = (GIdleTimerSource *)0x0;
  local_14 = 0;
  while( true ) {
    qVar2 = QList<GPollFDWithQSocketNotifier_*>::size(&pQVar1->socketNotifierSource->pollfds);
    if (qVar2 <= local_14) break;
    ppGVar3 = QList<GPollFDWithQSocketNotifier_*>::operator[]
                        ((QList<GPollFDWithQSocketNotifier_*> *)in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc0 = (QTimerInfoList *)*ppGVar3;
    g_source_remove_poll(pQVar1->socketNotifierSource,in_stack_ffffffffffffffc0);
    if (in_stack_ffffffffffffffc0 != (QTimerInfoList *)0x0) {
      operator_delete(in_stack_ffffffffffffffc0,0x10);
    }
    local_14 = local_14 + 1;
  }
  QList<GPollFDWithQSocketNotifier_*>::~QList((QList<GPollFDWithQSocketNotifier_*> *)0x8cf5d7);
  g_source_destroy(pQVar1->socketNotifierSource);
  g_source_unref(pQVar1->socketNotifierSource);
  pQVar1->socketNotifierSource = (GSocketNotifierSource *)0x0;
  g_source_destroy(pQVar1->postEventSource);
  g_source_unref(pQVar1->postEventSource);
  pQVar1->postEventSource = (GPostEventSource *)0x0;
  g_main_context_pop_thread_default(pQVar1->mainContext);
  g_main_context_unref(pQVar1->mainContext);
  pQVar1->mainContext = (GMainContext *)0x0;
  QAbstractEventDispatcherV2::~QAbstractEventDispatcherV2((QAbstractEventDispatcherV2 *)0x8cf683);
  return;
}

Assistant:

QEventDispatcherGlib::~QEventDispatcherGlib()
{
    Q_D(QEventDispatcherGlib);

    // destroy all timer sources
    d->timerSource->timerList.clearTimers();
    d->timerSource->timerList.~QTimerInfoList();
    g_source_destroy(&d->timerSource->source);
    g_source_unref(&d->timerSource->source);
    d->timerSource = nullptr;
    g_source_destroy(&d->idleTimerSource->source);
    g_source_unref(&d->idleTimerSource->source);
    d->idleTimerSource = nullptr;

    // destroy socket notifier source
    for (int i = 0; i < d->socketNotifierSource->pollfds.size(); ++i) {
        GPollFDWithQSocketNotifier *p = d->socketNotifierSource->pollfds[i];
        g_source_remove_poll(&d->socketNotifierSource->source, &p->pollfd);
        delete p;
    }
    d->socketNotifierSource->pollfds.~QList<GPollFDWithQSocketNotifier *>();
    g_source_destroy(&d->socketNotifierSource->source);
    g_source_unref(&d->socketNotifierSource->source);
    d->socketNotifierSource = nullptr;

    // destroy post event source
    g_source_destroy(&d->postEventSource->source);
    g_source_unref(&d->postEventSource->source);
    d->postEventSource = nullptr;

    Q_ASSERT(d->mainContext != nullptr);
#if GLIB_CHECK_VERSION (2, 22, 0)
    g_main_context_pop_thread_default (d->mainContext);
#endif
    g_main_context_unref(d->mainContext);
    d->mainContext = nullptr;
}